

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int x9_62_create_context(ptls_key_exchange_algorithm_t *algo,st_x9_62_keyex_context_t **ctx)

{
  st_x9_62_keyex_context_t *psVar1;
  BN_CTX *pBVar2;
  st_x9_62_keyex_context_t **local_50;
  undefined8 local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  st_x9_62_keyex_context_t **ppsStack_18;
  int ret;
  st_x9_62_keyex_context_t **ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  ppsStack_18 = ctx;
  ctx_local = (st_x9_62_keyex_context_t **)algo;
  psVar1 = (st_x9_62_keyex_context_t *)malloc(0x30);
  *ppsStack_18 = psVar1;
  if (psVar1 == (st_x9_62_keyex_context_t *)0x0) {
    local_1c = 0x201;
  }
  else {
    local_50 = ctx_local;
    local_48 = 0;
    local_40 = 0;
    local_38 = x9_62_on_exchange;
    local_30 = 0;
    local_28 = 0;
    memcpy(*ppsStack_18,&local_50,0x30);
    pBVar2 = BN_CTX_new();
    (*ppsStack_18)->bn_ctx = (BN_CTX *)pBVar2;
    if (pBVar2 == (BN_CTX *)0x0) {
      local_1c = 0x201;
    }
    else {
      local_1c = 0;
    }
  }
  if (local_1c != 0) {
    x9_62_free_context(*ppsStack_18);
    *ppsStack_18 = (st_x9_62_keyex_context_t *)0x0;
  }
  return local_1c;
}

Assistant:

static int x9_62_create_context(ptls_key_exchange_algorithm_t *algo, struct st_x9_62_keyex_context_t **ctx)
{
    int ret;

    if ((*ctx = (struct st_x9_62_keyex_context_t *)malloc(sizeof(**ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    **ctx = (struct st_x9_62_keyex_context_t){{algo, {NULL}, x9_62_on_exchange}};

    if (((*ctx)->bn_ctx = BN_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (ret != 0) {
        x9_62_free_context(*ctx);
        *ctx = NULL;
    }
    return ret;
}